

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralAttributeCheck.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::GeneralAttributeCheck::checkAttributes
          (GeneralAttributeCheck *this,DOMElement *elem,unsigned_short elemContext,
          TraverseSchema *schema,bool isTopLevel,ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList
          )

{
  short *psVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  XMLSize_t XVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined2 *puVar6;
  long *plVar7;
  long lVar8;
  DOMNode *pDVar9;
  XMLCh *str1;
  XMLCh *pXVar10;
  short *psVar11;
  undefined4 extraout_var_04;
  unsigned_short *puVar12;
  ulong uVar13;
  undefined4 extraout_var_05;
  short sVar14;
  XMLCh *pXVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  XMLByte attList [34];
  char local_58 [40];
  XMLCh *text1;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  if (nonXSAttList != (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0) {
    nonXSAttList->fCurCount = 0;
  }
  if (((elemContext < 0x32) && (elem != (DOMElement *)0x0)) &&
     (fAttMap != (ValueHashTableOf<unsigned_short,_xercesc_4_0::StringHasher> *)0x0)) {
    iVar5 = (*(elem->super_DOMNode)._vptr_DOMNode[0x18])(elem);
    text1 = (XMLCh *)CONCAT44(extraout_var,iVar5);
    iVar5 = (*(elem->super_DOMNode)._vptr_DOMNode[0x16])(elem);
    puVar6 = (undefined2 *)CONCAT44(extraout_var_00,iVar5);
    if (puVar6 != &SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
      if (puVar6 != (undefined2 *)0x0) {
        lVar8 = 0;
        do {
          psVar11 = (short *)((long)&SchemaSymbols::fgURI_SCHEMAFORSCHEMA + lVar8);
          if (*psVar11 == 0) {
            if (*(short *)((long)puVar6 + lVar8) == 0) goto LAB_003088ac;
            break;
          }
          psVar1 = (short *)((long)puVar6 + lVar8);
          lVar8 = lVar8 + 2;
        } while (*psVar11 == *psVar1);
      }
      TraverseSchema::reportSchemaError
                (schema,elem,L"http://apache.org/xml/messages/XMLErrors",0x94,text1,(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
    }
LAB_003088ac:
    iVar5 = (*(elem->super_DOMNode)._vptr_DOMNode[0xb])();
    plVar7 = (long *)CONCAT44(extraout_var_01,iVar5);
    lVar8 = (**(code **)(*plVar7 + 0x28))(plVar7);
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[0x18] = '\0';
    local_58[0x19] = '\0';
    local_58[0x1a] = '\0';
    local_58[0x1b] = '\0';
    local_58[0x1c] = '\0';
    local_58[0x1d] = '\0';
    local_58[0x1e] = '\0';
    local_58[0x1f] = '\0';
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x20] = '\0';
    local_58[0x21] = '\0';
    if (lVar8 != 0) {
      lVar18 = 0;
      do {
        pDVar9 = (DOMNode *)(**(code **)(*plVar7 + 0x18))(plVar7,lVar18);
        iVar5 = (*pDVar9->_vptr_DOMNode[2])(pDVar9);
        str1 = (XMLCh *)CONCAT44(extraout_var_02,iVar5);
        if (str1 != L"xmlns") {
          pXVar10 = L"xmlns";
          if (str1 == (XMLCh *)0x0) {
LAB_0030896f:
            if (*pXVar10 == L'\0') goto LAB_00308ba3;
          }
          else {
            pXVar10 = L"xmlns";
            pXVar15 = str1;
            do {
              XVar2 = *pXVar15;
              if (XVar2 == L'\0') goto LAB_0030896f;
              pXVar15 = pXVar15 + 1;
              XVar3 = *pXVar10;
              pXVar10 = pXVar10 + 1;
            } while (XVar2 == XVar3);
          }
          lVar16 = 0;
          do {
            psVar11 = (short *)((long)&XMLUni::fgXMLNSColonString + lVar16);
            lVar16 = lVar16 + 2;
          } while (*psVar11 != 0);
          iVar5 = XMLString::compareNString(str1,L"xmlns:",(lVar16 >> 1) - 1);
          if (iVar5 != 0) {
            if ((((XMLCh)(*str1 | 0x20U) == 0x78) && ((XMLCh)(str1[1] | 0x20U) == 0x6d)) &&
               ((XMLCh)(str1[2] | 0x20U) == 0x6c)) goto LAB_003089c6;
            iVar5 = (*pDVar9->_vptr_DOMNode[0x16])(pDVar9);
            psVar11 = (short *)CONCAT44(extraout_var_03,iVar5);
            if ((psVar11 == (short *)0x0) || (sVar14 = *psVar11, sVar14 == 0)) {
              iVar5 = (*pDVar9->_vptr_DOMNode[0x18])(pDVar9);
              str1 = (XMLCh *)CONCAT44(extraout_var_04,iVar5);
              puVar12 = ValueHashTableOf<unsigned_short,_xercesc_4_0::StringHasher>::get
                                  (fAttMap,str1,this->fMemoryManager);
              uVar13 = (ulong)*puVar12;
              lVar16 = (ulong)elemContext * 0x40 + (ulong)elemContext * 4;
              if ((fgElemAttTable[uVar13 * 2 + lVar16] & 3) != 0) {
                local_58[uVar13] = '\x01';
                iVar5 = (*pDVar9->_vptr_DOMNode[3])(pDVar9);
                validate(this,elem,str1,(XMLCh *)CONCAT44(extraout_var_05,iVar5),
                         *(ushort *)(fgElemAttTable + uVar13 * 2 + lVar16) & 0x1ffc,schema);
                goto LAB_00308ba3;
              }
            }
            else if (psVar11 != &SchemaSymbols::fgURI_SCHEMAFORSCHEMA) {
              lVar16 = 0;
              do {
                lVar17 = lVar16;
                if (sVar14 != *(short *)((long)&SchemaSymbols::fgURI_SCHEMAFORSCHEMA + lVar17)) {
                  if (text1 != L"appinfo") goto LAB_00308af7;
                  goto LAB_00308b7c;
                }
                sVar14 = *(short *)((long)psVar11 + lVar17 + 2);
                lVar16 = lVar17 + 2;
              } while (sVar14 != 0);
              if ((text1 != L"appinfo") && (*(short *)((long)&DAT_00367de2 + lVar17) != 0)) {
LAB_00308af7:
                pXVar10 = L"appinfo";
                if (text1 == (XMLCh *)0x0) {
LAB_00308b30:
                  if ((text1 != L"documentation") && (*pXVar10 != L'\0')) {
LAB_00308b3f:
                    pXVar10 = L"documentation";
                    if (text1 == (XMLCh *)0x0) {
LAB_00308b72:
                      if (*pXVar10 == L'\0') goto LAB_00308b7c;
                    }
                    else {
                      pXVar10 = L"documentation";
                      pXVar15 = text1;
                      do {
                        XVar2 = *pXVar15;
                        if (XVar2 == L'\0') goto LAB_00308b72;
                        pXVar15 = pXVar15 + 1;
                        XVar3 = *pXVar10;
                        pXVar10 = pXVar10 + 1;
                      } while (XVar2 == XVar3);
                    }
LAB_003089c6:
                    if (nonXSAttList != (ValueVectorOf<xercesc_4_0::DOMNode_*> *)0x0) {
                      ValueVectorOf<xercesc_4_0::DOMNode_*>::ensureExtraCapacity(nonXSAttList,1);
                      XVar4 = nonXSAttList->fCurCount;
                      nonXSAttList->fCurCount = XVar4 + 1;
                      nonXSAttList->fElemList[XVar4] = pDVar9;
                    }
                    goto LAB_00308ba3;
                  }
                }
                else {
                  pXVar10 = L"appinfo";
                  pXVar15 = text1;
                  do {
                    XVar2 = *pXVar15;
                    if (XVar2 == L'\0') goto LAB_00308b30;
                    pXVar15 = pXVar15 + 1;
                    XVar3 = *pXVar10;
                    pXVar10 = pXVar10 + 1;
                  } while (XVar2 == XVar3);
                  if (text1 != L"documentation") goto LAB_00308b3f;
                }
              }
            }
LAB_00308b7c:
            TraverseSchema::reportSchemaError
                      (schema,elem,L"http://apache.org/xml/messages/XMLErrors",
                       0x52 - (uint)isTopLevel,str1,text1,(XMLCh *)0x0,(XMLCh *)0x0);
          }
        }
LAB_00308ba3:
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar8);
    }
    lVar8 = 0;
    do {
      if (((fgElemAttTable[lVar8 * 2 + (ulong)elemContext * 0x40 + (ulong)elemContext * 4] & 1) != 0
          ) && (local_58[lVar8] == '\0')) {
        TraverseSchema::reportSchemaError
                  (schema,elem,L"http://apache.org/xml/messages/XMLErrors",0x50 - (uint)isTopLevel,
                   (XMLCh *)(&fAttNames)[lVar8],text1,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x22);
  }
  return;
}

Assistant:

void
GeneralAttributeCheck::checkAttributes(const DOMElement* const elem,
                                       const unsigned short elemContext,
                                       TraverseSchema* const schema,
                                       const bool isTopLevel,
                                       ValueVectorOf<DOMNode*>* const nonXSAttList)
{
    if (nonXSAttList)
        nonXSAttList->removeAllElements();

    if (elem == 0 || !fAttMap || elemContext>=E_Count)
        return;

    const XMLCh* elemName = elem->getLocalName();
    if (!XMLString::equals(SchemaSymbols::fgURI_SCHEMAFORSCHEMA, elem->getNamespaceURI())) {
        schema->reportSchemaError
        (
            elem
            , XMLUni::fgXMLErrDomain
            , XMLErrs::ELTSchemaNS
            , elemName
        );
    }

    DOMNamedNodeMap* eltAttrs = elem->getAttributes();
    const XMLSize_t  attrCount = eltAttrs->getLength();
    XMLByte          attList[A_Count];

    memset(attList, 0, sizeof(attList));

    for (XMLSize_t i = 0; i < attrCount; i++) {

        DOMNode*     attribute = eltAttrs->item(i);
        const XMLCh* attName = attribute->getNodeName();

        // skip namespace declarations
        if (XMLString::equals(attName, XMLUni::fgXMLNSString)
            || XMLString::startsWith(attName, XMLUni::fgXMLNSColonString))
            continue;

        // Bypass attributes that start with xml
        // add this to the list of "non-schema" attributes
        if ((*attName == chLatin_X || *attName == chLatin_x)
           && (*(attName+1) == chLatin_M || *(attName+1) == chLatin_m)
           && (*(attName+2) == chLatin_L || *(attName+2) == chLatin_l)) {

           if (nonXSAttList)
                nonXSAttList->addElement(attribute);

            continue;
        }

        // for attributes with namespace prefix
        const XMLCh* attrURI = attribute->getNamespaceURI();

        if (attrURI != 0 && *attrURI) {

            // attributes with schema namespace are not allowed
            // and not allowed on "documentation" and "appInfo"
            if (XMLString::equals(attrURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA) ||
                XMLString::equals(elemName, SchemaSymbols::fgELT_APPINFO) ||
                XMLString::equals(elemName, SchemaSymbols::fgELT_DOCUMENTATION)) {

                schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain,
                                          isTopLevel?XMLErrs::AttributeDisallowedGlobal:XMLErrs::AttributeDisallowedLocal, 
                                          attName, elemName);
            }
            else if (nonXSAttList)
            {
                nonXSAttList->addElement(attribute);
            }

            continue;
        }

        int attNameId = A_Invalid;
        attName = attribute->getLocalName();

        bool bContinue=false;   // workaround for Borland bug with 'continue' in 'catch'
        try {
            attNameId= fAttMap->get(attName, fMemoryManager);
        }
        catch(const OutOfMemoryException&)
        {
            throw;
        }
        catch(...) {

            schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain,
                                      isTopLevel?XMLErrs::AttributeDisallowedGlobal:XMLErrs::AttributeDisallowedLocal, 
                                      attName, elemName);
            bContinue=true;
        }
        if(bContinue)
            continue;

        if (fgElemAttTable[elemContext][attNameId] & Att_Mask) {

            attList[attNameId] = 1;
            validate
            (
                elem
                , attName
                , attribute->getNodeValue()
                , fgElemAttTable[elemContext][attNameId] & DV_Mask
                , schema
            );
        }
        else {
            schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain,
                                      isTopLevel?XMLErrs::AttributeDisallowedGlobal:XMLErrs::AttributeDisallowedLocal, 
                                      attName, elemName);
        }
    }

    // ------------------------------------------------------------------
    // Check for required attributes
    // ------------------------------------------------------------------
    for (unsigned int j=0; j < A_Count; j++) {

        if ((fgElemAttTable[elemContext][j] & Att_Required) && attList[j] == 0) {
            schema->reportSchemaError(elem, XMLUni::fgXMLErrDomain, 
                                      isTopLevel?XMLErrs::AttributeRequiredGlobal:XMLErrs::AttributeRequiredLocal, 
                                      fAttNames[j], elemName);
        }
    }
}